

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

int http_open(HTTP_INFO *hi,char *url)

{
  BOOL verify;
  int iVar1;
  int iVar2;
  size_t sVar3;
  byte https_00;
  int opt;
  char port [10];
  socklen_t slen;
  int https;
  char host [256];
  char dir [1024];
  
  if (hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  verify = (hi->tls).verify;
  parse_url(url,&https,host,port,dir);
  iVar2 = (hi->tls).ssl_fd.fd;
  if (iVar2 == -1) {
LAB_00111ac6:
    https_00 = (byte)https;
  }
  else {
    https_00 = (hi->url).https;
    if (((https != (uint)https_00) || (iVar1 = strcmp((hi->url).host,host), iVar1 != 0)) ||
       (iVar1 = strcmp((hi->url).port,port), iVar1 != 0)) {
      https_close(hi);
      goto LAB_00111ac6;
    }
    slen = 4;
    iVar2 = getsockopt(iVar2,1,4,&opt,&slen);
    if ((-1 < iVar2) && (opt < 1)) goto LAB_00111aec;
    https_close(hi);
  }
  https_init(hi,https_00,verify);
  iVar2 = https_connect(hi,host,port);
  if (iVar2 < 0) {
    https_close(hi);
    _error = iVar2;
    return -1;
  }
LAB_00111aec:
  sVar3 = strlen(host);
  strncpy((hi->url).host,host,sVar3);
  sVar3 = strlen(port);
  strncpy((hi->url).port,port,sVar3);
  sVar3 = strlen(dir);
  strncpy((hi->url).path,dir,sVar3);
  return 0;
}

Assistant:

int http_open(HTTP_INFO *hi, char *url)
{
    char        host[256], port[10], dir[1024];
    int         sock_fd, https, verify;
    int         ret, opt;
    socklen_t   slen;


    if (NULL == hi) return -1;

    verify = hi->tls.verify;

    parse_url(url, &https, host, port, dir);

    if ((hi->tls.ssl_fd.fd == -1) || (hi->url.https != https) ||
        (strcmp(hi->url.host, host) != 0) || (strcmp(hi->url.port, port) != 0))
    {
        if (hi->tls.ssl_fd.fd != -1)
            https_close(hi);

        https_init(hi, https, verify);

        if ((ret = https_connect(hi, host, port)) < 0)
        {
            https_close(hi);

            _error = ret;

            return -1;
        }
    }
    else
    {
        sock_fd = hi->tls.ssl_fd.fd;

        slen = sizeof(int);

        if ((getsockopt(sock_fd, SOL_SOCKET, SO_ERROR, (void *) &opt, &slen) < 0) || (opt > 0))
        {
            https_close(hi);

            https_init(hi, https, verify);

            if ((ret = https_connect(hi, host, port)) < 0)
            {
                https_close(hi);

                _error = ret;

                return -1;
            }
        }
//      else
//          printf("socket reuse: %d \n", sock_fd);
    }

    strncpy(hi->url.host, host, strlen(host));
    strncpy(hi->url.port, port, strlen(port));
    strncpy(hi->url.path, dir, strlen(dir));

    return 0;
}